

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,size_t primID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  vfloat4 a0_1;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vfloat4 a0;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  float fVar24;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  float fVar33;
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                      super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar5 = (uVar1 + 1) * sVar4;
  lVar6 = (uVar1 + 2) * sVar4;
  lVar7 = (uVar1 + 3) * sVar4;
  fVar15 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar17 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + uVar1 * sVar4),
                          ZEXT416((uint)(fVar15 * *(float *)(pcVar3 + uVar1 * sVar4 + 0xc))),0x30);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar5),
                         ZEXT416((uint)(fVar15 * *(float *)(pcVar3 + lVar5 + 0xc))),0x30);
  auVar32 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar6),
                          ZEXT416((uint)(fVar15 * *(float *)(pcVar3 + lVar6 + 0xc))),0x30);
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar7),
                          ZEXT416((uint)(fVar15 * *(float *)(pcVar3 + lVar7 + 0xc))),0x30);
  fVar24 = auVar32._0_4_;
  fVar29 = auVar32._4_4_;
  fVar30 = auVar32._8_4_;
  fVar31 = auVar32._12_4_;
  fVar15 = auVar8._0_4_;
  fVar21 = auVar8._4_4_;
  fVar22 = auVar8._8_4_;
  fVar23 = auVar8._12_4_;
  auVar32._0_4_ = auVar17._0_4_ * 0.16666667 + fVar15 * 0.6666667 + fVar24 * 0.16666667;
  auVar32._4_4_ = auVar17._4_4_ * 0.16666667 + fVar21 * 0.6666667 + fVar29 * 0.16666667;
  auVar32._8_4_ = auVar17._8_4_ * 0.16666667 + fVar22 * 0.6666667 + fVar30 * 0.16666667;
  auVar32._12_4_ = auVar17._12_4_ * 0.16666667 + fVar23 * 0.6666667 + fVar31 * 0.16666667;
  auVar8._0_4_ = fVar15 * 0.16666667 + fVar24 * 0.6666667 + auVar10._0_4_ * 0.16666667;
  auVar8._4_4_ = fVar21 * 0.16666667 + fVar29 * 0.6666667 + auVar10._4_4_ * 0.16666667;
  auVar8._8_4_ = fVar22 * 0.16666667 + fVar30 * 0.6666667 + auVar10._8_4_ * 0.16666667;
  auVar8._12_4_ = fVar23 * 0.16666667 + fVar31 * 0.6666667 + auVar10._12_4_ * 0.16666667;
  auVar11 = vsubps_avx(auVar8,auVar32);
  auVar8 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar32 = vrsqrtss_avx(auVar8,auVar8);
  fVar33 = auVar32._0_4_;
  auVar32 = ZEXT416((uint)(fVar33 * 1.5 - auVar8._0_4_ * 0.5 * fVar33 * fVar33 * fVar33));
  auVar32 = vshufps_avx(auVar32,auVar32,0);
  auVar9._0_4_ = auVar11._0_4_ * auVar32._0_4_;
  auVar9._4_4_ = auVar11._4_4_ * auVar32._4_4_;
  auVar9._8_4_ = auVar11._8_4_ * auVar32._8_4_;
  auVar9._12_4_ = auVar11._12_4_ * auVar32._12_4_;
  if (1e-18 < auVar8._0_4_) {
    auVar25._0_4_ = fVar24 * 0.5 + auVar10._0_4_ * 0.0;
    auVar25._4_4_ = fVar29 * 0.5 + auVar10._4_4_ * 0.0;
    auVar25._8_4_ = fVar30 * 0.5 + auVar10._8_4_ * 0.0;
    auVar25._12_4_ = fVar31 * 0.5 + auVar10._12_4_ * 0.0;
    auVar16._0_4_ = fVar15 * 0.0;
    auVar16._4_4_ = fVar21 * 0.0;
    auVar16._8_4_ = fVar22 * 0.0;
    auVar16._12_4_ = fVar23 * 0.0;
    auVar8 = vsubps_avx(auVar25,auVar16);
    auVar10._0_4_ = auVar17._0_4_ * 0.5;
    auVar10._4_4_ = auVar17._4_4_ * 0.5;
    auVar10._8_4_ = auVar17._8_4_ * 0.5;
    auVar10._12_4_ = auVar17._12_4_ * 0.5;
    auVar32 = vsubps_avx(auVar8,auVar10);
    auVar8 = vshufps_avx(auVar32,auVar32,0xc9);
    auVar17 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar11._0_4_ = auVar32._0_4_ * auVar17._0_4_;
    auVar11._4_4_ = auVar32._4_4_ * auVar17._4_4_;
    auVar11._8_4_ = auVar32._8_4_ * auVar17._8_4_;
    auVar11._12_4_ = auVar32._12_4_ * auVar17._12_4_;
    auVar17._0_4_ = auVar8._0_4_ * auVar9._0_4_;
    auVar17._4_4_ = auVar8._4_4_ * auVar9._4_4_;
    auVar17._8_4_ = auVar8._8_4_ * auVar9._8_4_;
    auVar17._12_4_ = auVar8._12_4_ * auVar9._12_4_;
    auVar8 = vsubps_avx(auVar17,auVar11);
    auVar8 = vshufps_avx(auVar8,auVar8,0xc9);
  }
  else {
    auVar8 = ZEXT816(0x3f80000000000000);
    auVar9 = _DAT_01f46750;
  }
  auVar17 = vdpps_avx(auVar8,auVar8,0x7f);
  if (auVar17._0_4_ <= 1e-18) {
    auVar17 = vshufpd_avx(auVar9,auVar9,1);
    auVar8 = vmovshdup_avx(auVar9);
    auVar27._8_4_ = 0x80000000;
    auVar27._0_8_ = 0x8000000080000000;
    auVar27._12_4_ = 0x80000000;
    auVar20._0_4_ = auVar8._0_4_ ^ 0x80000000;
    auVar8 = vunpckhps_avx(auVar9,ZEXT816(0) << 0x40);
    auVar20._4_12_ = ZEXT812(0) << 0x20;
    auVar10 = vshufps_avx(auVar8,auVar20,0x41);
    auVar13._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
    auVar13._8_8_ = auVar17._8_8_ ^ auVar27._8_8_;
    auVar32 = vinsertps_avx(auVar13,auVar9,0x2a);
    auVar8 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar17 = vdpps_avx(auVar32,auVar32,0x7f);
    auVar8 = vcmpps_avx(auVar17,auVar8,1);
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    auVar8 = vblendvps_avx(auVar32,auVar10,auVar8);
    auVar17 = vdpps_avx(auVar8,auVar8,0x7f);
    auVar32 = vrsqrtss_avx(auVar17,auVar17);
    fVar15 = auVar32._0_4_;
    auVar17 = ZEXT416((uint)(fVar15 * 1.5 - auVar17._0_4_ * 0.5 * fVar15 * fVar15 * fVar15));
    auVar17 = vshufps_avx(auVar17,auVar17,0);
    aVar19._0_4_ = auVar8._0_4_ * auVar17._0_4_;
    aVar19._4_4_ = auVar8._4_4_ * auVar17._4_4_;
    aVar19._8_4_ = auVar8._8_4_ * auVar17._8_4_;
    aVar19._12_4_ = auVar8._12_4_ * auVar17._12_4_;
    auVar8 = vshufps_avx((undefined1  [16])aVar19,(undefined1  [16])aVar19,0xc9);
    auVar17 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar28._0_4_ = auVar17._0_4_ * aVar19._0_4_;
    auVar28._4_4_ = auVar17._4_4_ * aVar19._4_4_;
    auVar28._8_4_ = auVar17._8_4_ * aVar19._8_4_;
    auVar28._12_4_ = auVar17._12_4_ * aVar19._12_4_;
    auVar14._0_4_ = auVar9._0_4_ * auVar8._0_4_;
    auVar14._4_4_ = auVar9._4_4_ * auVar8._4_4_;
    auVar14._8_4_ = auVar9._8_4_ * auVar8._8_4_;
    auVar14._12_4_ = auVar9._12_4_ * auVar8._12_4_;
    auVar8 = vsubps_avx(auVar14,auVar28);
    auVar32 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar8 = vdpps_avx(auVar32,auVar32,0x7f);
    auVar17 = vrsqrtss_avx(auVar8,auVar8);
    fVar15 = auVar17._0_4_;
    auVar8 = ZEXT416((uint)(fVar15 * 1.5 - auVar8._0_4_ * 0.5 * fVar15 * fVar15 * fVar15));
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    aVar12._0_4_ = auVar8._0_4_ * auVar32._0_4_;
    aVar12._4_4_ = auVar8._4_4_ * auVar32._4_4_;
    aVar12._8_4_ = auVar8._8_4_ * auVar32._8_4_;
    aVar12._12_4_ = auVar8._12_4_ * auVar32._12_4_;
  }
  else {
    auVar32 = vrsqrtss_avx(auVar17,auVar17);
    fVar15 = auVar32._0_4_;
    auVar17 = ZEXT416((uint)(fVar15 * 1.5 - auVar17._0_4_ * 0.5 * fVar15 * fVar15 * fVar15));
    auVar17 = vshufps_avx(auVar17,auVar17,0);
    aVar12._0_4_ = auVar8._0_4_ * auVar17._0_4_;
    aVar12._4_4_ = auVar8._4_4_ * auVar17._4_4_;
    aVar12._8_4_ = auVar8._8_4_ * auVar17._8_4_;
    aVar12._12_4_ = auVar8._12_4_ * auVar17._12_4_;
    auVar8 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar17 = vshufps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0xc9);
    auVar26._0_4_ = auVar9._0_4_ * auVar17._0_4_;
    auVar26._4_4_ = auVar9._4_4_ * auVar17._4_4_;
    auVar26._8_4_ = auVar9._8_4_ * auVar17._8_4_;
    auVar26._12_4_ = auVar9._12_4_ * auVar17._12_4_;
    auVar18._0_4_ = auVar8._0_4_ * aVar12._0_4_;
    auVar18._4_4_ = auVar8._4_4_ * aVar12._4_4_;
    auVar18._8_4_ = auVar8._8_4_ * aVar12._8_4_;
    auVar18._12_4_ = auVar8._12_4_ * aVar12._12_4_;
    auVar8 = vsubps_avx(auVar18,auVar26);
    auVar32 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar8 = vdpps_avx(auVar32,auVar32,0x7f);
    auVar17 = vrsqrtss_avx(auVar8,auVar8);
    fVar15 = auVar17._0_4_;
    auVar8 = ZEXT416((uint)(fVar15 * 1.5 - auVar8._0_4_ * 0.5 * fVar15 * fVar15 * fVar15));
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    aVar19._0_4_ = auVar8._0_4_ * auVar32._0_4_;
    aVar19._4_4_ = auVar8._4_4_ * auVar32._4_4_;
    aVar19._8_4_ = auVar8._8_4_ * auVar32._8_4_;
    aVar19._12_4_ = auVar8._12_4_ * auVar32._12_4_;
  }
  (__return_storage_ptr__->vx).field_0 = aVar19;
  (__return_storage_ptr__->vy).field_0 = aVar12;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar9;
  return __return_storage_ptr__;
}

Assistant:

__forceinline const T& operator [](size_t i) const { assert(i<num); return *(T*)(ptr_ofs + i*stride); }